

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknetshortcut.cpp
# Opt level: O1

int __thiscall
ncnn::DarknetShortcut::forward
          (DarknetShortcut *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pMVar7;
  Mat *pMVar8;
  int *piVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  float *pfVar19;
  void *pvVar20;
  float *pfVar21;
  long lVar22;
  ulong uVar23;
  void *pvVar24;
  ulong local_a8;
  Mat local_78;
  
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = pMVar7->w;
  iVar4 = pMVar7->h;
  iVar5 = pMVar7[1].w;
  iVar6 = pMVar7[1].h;
  uVar23 = (long)iVar3 / (long)iVar5 & 0xffffffff;
  uVar18 = iVar5 / iVar3;
  iVar17 = -1;
  iVar14 = (int)((long)iVar3 / (long)iVar5);
  if ((iVar14 == iVar4 / iVar6) && (uVar18 == iVar6 / iVar4)) {
    if (iVar14 < 2) {
      uVar23 = 1;
    }
    uVar16 = 1;
    if (1 < (int)uVar18) {
      uVar16 = uVar18;
    }
    if (iVar3 < iVar5) {
      iVar5 = iVar3;
    }
    if (iVar4 < iVar6) {
      iVar6 = iVar4;
    }
    uVar18 = pMVar7[1].c;
    if (pMVar7->c < pMVar7[1].c) {
      uVar18 = pMVar7->c;
    }
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::clone(&local_78,(__fn *)(pMVar7 + 1),(void *)0x0,(int)top_blobs,(void *)0xffffffff);
    if (pMVar8 != &local_78) {
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + 1;
        UNLOCK();
      }
      piVar9 = pMVar8->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (pMVar8->allocator == (Allocator *)0x0) {
            if (pMVar8->data != (void *)0x0) {
              free(pMVar8->data);
            }
          }
          else {
            (**(code **)(*(long *)pMVar8->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&pMVar8->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar8->elemsize + 4) = 0;
      pMVar8->data = (void *)0x0;
      pMVar8->refcount = (int *)0x0;
      pMVar8->dims = 0;
      pMVar8->w = 0;
      pMVar8->h = 0;
      pMVar8->c = 0;
      pMVar8->cstep = 0;
      pMVar8->data = local_78.data;
      pMVar8->refcount = local_78.refcount;
      pMVar8->elemsize = local_78.elemsize;
      pMVar8->elempack = local_78.elempack;
      pMVar8->allocator = local_78.allocator;
      pMVar8->dims = local_78.dims;
      pMVar8->w = local_78.w;
      pMVar8->h = local_78.h;
      pMVar8->c = local_78.c;
      pMVar8->cstep = local_78.cstep;
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (**(code **)(*(long *)local_78.allocator + 0x18))();
        }
      }
    }
    iVar17 = -100;
    if ((pMVar8->data != (void *)0x0) && ((long)pMVar8->c * pMVar8->cstep != 0)) {
      if (0 < (int)uVar18) {
        uVar13 = (ulong)uVar16;
        local_a8 = 0;
        do {
          if (0 < iVar6) {
            iVar3 = pMVar7->w;
            iVar4 = pMVar7[1].w;
            sVar10 = pMVar7->elemsize;
            sVar11 = pMVar7[1].elemsize;
            sVar12 = pMVar8->elemsize;
            pvVar24 = (void *)(pMVar8->cstep * sVar12 * local_a8 + (long)pMVar8->data);
            iVar17 = pMVar8->w;
            pvVar20 = (void *)(sVar11 * pMVar7[1].cstep * local_a8 + (long)pMVar7[1].data);
            pfVar21 = (float *)(sVar10 * pMVar7->cstep * local_a8 + (long)pMVar7->data);
            iVar14 = 0;
            do {
              if (0 < iVar5) {
                lVar22 = 0;
                pfVar19 = pfVar21;
                iVar15 = iVar5;
                do {
                  uVar1 = this->alpha;
                  uVar2 = this->beta;
                  *(float *)((long)pvVar24 + lVar22) =
                       *pfVar19 * (float)uVar2 + *(float *)((long)pvVar20 + lVar22) * (float)uVar1;
                  lVar22 = lVar22 + uVar13 * 4;
                  pfVar19 = pfVar19 + uVar23;
                  iVar15 = iVar15 + -1;
                } while (iVar15 != 0);
              }
              iVar14 = iVar14 + 1;
              pvVar24 = (void *)((long)pvVar24 + sVar12 * uVar13 * (long)iVar17);
              pvVar20 = (void *)((long)pvVar20 + uVar13 * sVar11 * (long)iVar4);
              pfVar21 = (float *)((long)pfVar21 + uVar23 * sVar10 * (long)iVar3);
            } while (iVar14 != iVar6);
          }
          local_a8 = local_a8 + 1;
        } while (local_a8 != uVar18);
      }
      iVar17 = 0;
    }
  }
  return iVar17;
}

Assistant:

int DarknetShortcut::forward(const std::vector<Mat> &bottom_blobs,
                             std::vector<Mat> &top_blobs,
                             const Option &opt) const
{
  const Mat &bottom_blob = bottom_blobs[0];
  int w = bottom_blob.w;
  int h = bottom_blob.h;
  int c = bottom_blob.c;

  const Mat &bottom_blob1 = bottom_blobs[1];
  int o_w = bottom_blob1.w;
  int o_h = bottom_blob1.h;
  int o_c = bottom_blob1.c;

  int i_stride = w / o_w;
  int o_stride = o_w / w;
  if (i_stride != h / o_h) return -1;
  if (o_stride != o_h / h) return -1;
  i_stride = i_stride < 1 ? 1 : i_stride;
  o_stride = o_stride < 1 ? 1 : o_stride;

  int op_w = w < o_w ? w : o_w;
  int op_h = h < o_h ? h : o_h;
  int op_c = c < o_c ? c : o_c;

  Mat &top_blob = top_blobs[0];
  size_t elemsize = bottom_blob.elemsize;
  top_blob = bottom_blob1.clone();
  if (top_blob.empty())
    return -100;

  #pragma omp parallel for num_threads(opt.num_threads)
  for (int q = 0; q < op_c; q++)
  {

    int out_offset_h = 0;
    int in_offset_h = 0;

    for (int hi = 0; hi < op_h; hi++)
    {

      const float *ptr1 = bottom_blob.channel(q).row(in_offset_h);
      const float *ptr2 = bottom_blob1.channel(q).row(out_offset_h);
      float *outptr = top_blob.channel(q).row(out_offset_h);

      out_offset_h += o_stride;
      in_offset_h += i_stride;

      for (int i = 0; i < op_w; i++)
      {
        *outptr = alpha * (*ptr2) + beta * (*ptr1);

        ptr2 += o_stride;
        ptr1 += i_stride;
        outptr += o_stride;
      }
    }
  }

  return 0;
}